

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreferenced_variadic.cpp
# Opt level: O2

int main(void)

{
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  add_values<int>((vector<int,_std::allocator<int>_> *)&local_30,4,1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  add_values<int,int>((vector<int,_std::allocator<int>_> *)&local_48,4,1,2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int main()
{
  // expected: no warnings or errors in this code
  add_values(4);
  add_values(4, 1);
  add_values(4, 1, 2);
}